

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

void __thiscall
QTableModel::setHorizontalHeaderItem(QTableModel *this,int section,QTableWidgetItem *item)

{
  QTableWidgetItem *pQVar1;
  QTableWidget *pQVar2;
  pointer ppQVar3;
  ulong uVar4;
  
  if (((-1 < section) &&
      (uVar4 = (ulong)(uint)section, uVar4 < (ulong)(this->horizontalHeaderItems).d.size)) &&
     (pQVar1 = (this->horizontalHeaderItems).d.ptr[uVar4], pQVar1 != item)) {
    if (pQVar1 != (QTableWidgetItem *)0x0) {
      pQVar1->view = (QTableWidget *)0x0;
      (*pQVar1->_vptr_QTableWidgetItem[1])();
    }
    pQVar2 = (QTableWidget *)QMetaObject::cast((QObject *)&QTableWidget::staticMetaObject);
    if (item != (QTableWidgetItem *)0x0) {
      item->view = pQVar2;
      item->d->headerItem = true;
    }
    ppQVar3 = QList<QTableWidgetItem_*>::data(&this->horizontalHeaderItems);
    ppQVar3[uVar4] = item;
    QAbstractItemModel::headerDataChanged((Orientation)this,1,section);
    return;
  }
  return;
}

Assistant:

void QTableModel::setHorizontalHeaderItem(int section, QTableWidgetItem *item)
{
    if (section < 0 || section >= horizontalHeaderItems.size())
        return;
    QTableWidgetItem *oldItem = horizontalHeaderItems.at(section);
    if (item == oldItem)
        return;

    if (oldItem)
        oldItem->view = nullptr;
    delete oldItem;

    QTableWidget *view = this->view();

    if (item) {
        item->view = view;
        item->d->headerItem = true;
    }
    horizontalHeaderItems[section] = item;
    emit headerDataChanged(Qt::Horizontal, section, section);
}